

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O2

BinaryPacketProtocol * ssh2_bpp_new(LogContext *logctx,DataTransferStats *stats,_Bool is_server)

{
  void *__s;
  
  __s = safemalloc(1,0x1c8,0);
  memset(__s,0,0x1c8);
  *(BinaryPacketProtocolVtable **)((long)__s + 0xe8) = &ssh2_bpp_vtable;
  *(LogContext **)((long)__s + 0x180) = logctx;
  *(DataTransferStats **)((long)__s + 0x68) = stats;
  *(_Bool *)((long)__s + 0xd8) = is_server;
  ssh_bpp_common_setup((BinaryPacketProtocol *)((long)__s + 0xe8));
  return (BinaryPacketProtocol *)((long)__s + 0xe8);
}

Assistant:

BinaryPacketProtocol *ssh2_bpp_new(
    LogContext *logctx, struct DataTransferStats *stats, bool is_server)
{
    struct ssh2_bpp_state *s = snew(struct ssh2_bpp_state);
    memset(s, 0, sizeof(*s));
    s->bpp.vt = &ssh2_bpp_vtable;
    s->bpp.logctx = logctx;
    s->stats = stats;
    s->is_server = is_server;
    ssh_bpp_common_setup(&s->bpp);
    return &s->bpp;
}